

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SimpleDictionaryTypeHandler.cpp
# Opt level: O1

BOOL __thiscall
Js::SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false>::IsEnumerable
          (SimpleDictionaryTypeHandlerBase<unsigned_short,_Js::JavascriptString_*,_false> *this,
          DynamicObject *instance,PropertyId propertyId)

{
  BaseDictionary<Js::JavascriptString_*,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_Memory::RecyclerNonLeafAllocator,_DictionarySizePolicy<PowerOf2Policy,_1U,_2U,_1U,_4U>,_Js::PropertyRecordStringHashComparer,_Js::PropertyMapKeyTraits<Js::JavascriptString_*>::Entry,_JsUtil::NoResizeLock>
  *this_00;
  code *pcVar1;
  bool bVar2;
  uint uVar3;
  undefined4 *puVar4;
  PropertyRecord *local_30;
  PropertyRecord *propertyRecord;
  
  if (propertyId == -1) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar4 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/SimpleDictionaryTypeHandler.cpp"
                                ,0x722,"(propertyId != Constants::NoProperty)",
                                "propertyId != Constants::NoProperty");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  local_30 = ScriptContext::GetPropertyName
                       ((((((instance->super_RecyclableObject).type.ptr)->javascriptLibrary).ptr)->
                        super_JavascriptLibraryBase).scriptContext.ptr,propertyId);
  this_00 = (this->propertyMap).ptr;
  uVar3 = JsUtil::
          BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
          ::FindEntryWithKey<Js::PropertyRecord_const*>
                    ((BaseDictionary<Js::JavascriptString*,Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,Memory::RecyclerNonLeafAllocator,DictionarySizePolicy<PowerOf2Policy,1u,2u,1u,4u>,Js::PropertyRecordStringHashComparer,Js::PropertyMapKeyTraits<Js::JavascriptString*>::Entry,JsUtil::NoResizeLock>
                      *)this_00,&local_30);
  if ((int)uVar3 < 0) {
    uVar3 = 1;
  }
  else {
    uVar3 = (uint)((*(PropertyAttributes *)
                     ((long)&(this_00->entries).ptr[uVar3].
                             super_DictionaryEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                             .
                             super_CacheHashedEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntry>
                             .
                             super_KeyValueEntry<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                             .
                             super_ValueEntry<Js::SimpleDictionaryPropertyDescriptor<unsigned_short>,_JsUtil::(anonymous_namespace)::KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>_>
                             .
                             super_KeyValueEntryDataLayout2<Memory::WriteBarrierPtr<Js::JavascriptString>,_Js::SimpleDictionaryPropertyDescriptor<unsigned_short>_>
                             .value + 1) & 0x11) != 0);
  }
  return uVar3;
}

Assistant:

BOOL SimpleDictionaryTypeHandlerBase<TPropertyIndex, TMapKey, IsNotExtensibleSupported>::IsEnumerable(DynamicObject* instance, PropertyId propertyId)
    {
        SimpleDictionaryPropertyDescriptor<TPropertyIndex>* descriptor;
        Assert(propertyId != Constants::NoProperty);
        PropertyRecord const* propertyRecord = instance->GetScriptContext()->GetPropertyName(propertyId);
        if (propertyMap->TryGetReference(propertyRecord, &descriptor))
        {
            if (descriptor->Attributes & PropertyLetConstGlobal)
            {
                return true;
            }
            return descriptor->Attributes & PropertyEnumerable;
        }
        return true;
    }